

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourceReleaseQueue.hpp
# Opt level: O0

void __thiscall
Diligent::ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper>::ResourceReleaseQueue
          (ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper> *this,
          IMemoryAllocator *Allocator)

{
  STDAllocator<std::pair<unsigned_long,_Diligent::DynamicStaleResourceWrapper>,_Diligent::IMemoryAllocator>
  local_58;
  STDAllocator<std::pair<unsigned_long,_Diligent::DynamicStaleResourceWrapper>,_Diligent::IMemoryAllocator>
  local_38;
  IMemoryAllocator *local_18;
  IMemoryAllocator *Allocator_local;
  ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper> *this_local;
  
  local_18 = Allocator;
  Allocator_local = (IMemoryAllocator *)this;
  std::mutex::mutex(&this->m_ReleaseQueueMutex);
  STDAllocator<std::pair<unsigned_long,_Diligent::DynamicStaleResourceWrapper>,_Diligent::IMemoryAllocator>
  ::STDAllocator(&local_38,local_18,"Allocator for deque<ReleaseQueueElemType>",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/ResourceReleaseQueue.hpp"
                 ,0xe6);
  std::
  deque<std::pair<unsigned_long,_Diligent::DynamicStaleResourceWrapper>,_Diligent::STDAllocator<std::pair<unsigned_long,_Diligent::DynamicStaleResourceWrapper>,_Diligent::IMemoryAllocator>_>
  ::deque(&this->m_ReleaseQueue,&local_38);
  std::mutex::mutex(&this->m_StaleObjectsMutex);
  STDAllocator<std::pair<unsigned_long,_Diligent::DynamicStaleResourceWrapper>,_Diligent::IMemoryAllocator>
  ::STDAllocator(&local_58,local_18,"Allocator for deque<ReleaseQueueElemType>",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/ResourceReleaseQueue.hpp"
                 ,0xe7);
  std::
  deque<std::pair<unsigned_long,_Diligent::DynamicStaleResourceWrapper>,_Diligent::STDAllocator<std::pair<unsigned_long,_Diligent::DynamicStaleResourceWrapper>,_Diligent::IMemoryAllocator>_>
  ::deque(&this->m_StaleResources,&local_58);
  return;
}

Assistant:

ResourceReleaseQueue(IMemoryAllocator& Allocator) :
        m_ReleaseQueue  (STD_ALLOCATOR_RAW_MEM(ReleaseQueueElemType, Allocator, "Allocator for deque<ReleaseQueueElemType>")),
        m_StaleResources(STD_ALLOCATOR_RAW_MEM(ReleaseQueueElemType, Allocator, "Allocator for deque<ReleaseQueueElemType>"))
    {}